

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTest.cpp
# Opt level: O3

void __thiscall
oout::ContainTest::ContainTest
          (ContainTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match
          )

{
  undefined1 local_29;
  MatchTest *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTest_00197f68;
  local_28 = (MatchTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::Text_const>const&,std::shared_ptr<oout::Match_const>const&>
            (a_Stack_20,&local_28,(allocator<oout::MatchTest> *)&local_29,text,match);
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_28->super_Test;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_20[0]._M_pi;
  return;
}

Assistant:

ContainTest::ContainTest(
	const shared_ptr<const Text> &text,
	const shared_ptr<const Match> &match
) : test(make_shared<MatchTest>(text, match))
{
}